

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void __thiscall
Output::compute_solvation_energy
          (Output *this,InterpolationPoints *elem_interp_pts,Tree *elem_tree,
          InterpolationPoints *mol_interp_pts,Tree *mol_tree,InteractionList *interaction_list)

{
  long in_RDI;
  SolvationEnergyCompute *in_R8;
  double dVar1;
  SolvationEnergyCompute solvation_energy;
  size_t potential_num;
  double *potential_ptr;
  Timer *in_stack_fffffffffffffe60;
  Timer *in_stack_fffffffffffffe70;
  double in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  Molecule *in_stack_ffffffffffffff18;
  Tree *in_stack_ffffffffffffff20;
  InterpolationPoints *in_stack_ffffffffffffff28;
  Elements *in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  SolvationEnergyCompute *in_stack_ffffffffffffff40;
  InterpolationPoints *in_stack_ffffffffffffff50;
  Tree *in_stack_ffffffffffffff58;
  InteractionList *in_stack_ffffffffffffff60;
  
  Timer::start(in_stack_fffffffffffffe60);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x12ec94);
  std::vector<double,_std::allocator<double>_>::size
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38));
  SolvationEnergyCompute::SolvationEnergyCompute
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  dVar1 = SolvationEnergyCompute::compute(in_R8);
  *(double *)(in_RDI + 0x50) = dVar1;
  Timer::stop(in_stack_fffffffffffffe70);
  SolvationEnergyCompute::~SolvationEnergyCompute(in_R8);
  return;
}

Assistant:

void Output::compute_solvation_energy(const class InterpolationPoints& elem_interp_pts, const class Tree& elem_tree,
                                      const class InterpolationPoints& mol_interp_pts,  const class Tree& mol_tree,
                                      const class InteractionList& interaction_list)
{
    timers_.compute_solvation_energy.start();
    const double* __restrict potential_ptr = potential_.data();
    std::size_t potential_num = potential_.size();
    
#ifdef OPENACC_ENABLED
    #pragma acc enter data copyin(potential_ptr[0:potential_num])
#endif
    
    class SolvationEnergyCompute solvation_energy(potential_,
                                                  elements_, elem_interp_pts, elem_tree,
                                                  molecule_, mol_interp_pts, mol_tree,
                                                  interaction_list, params_.phys_eps_, params_.phys_kappa_);
                                                  
    solvation_energy_ = solvation_energy.compute();
    
#ifdef OPENACC_ENABLED
    #pragma acc exit data delete(potential_ptr[0:potential_num])
#endif

    timers_.compute_solvation_energy.stop();
}